

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  uint uVar1;
  ulong uVar2;
  byte c;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar2 = 0;
  do {
    uVar9 = (this->m_str).m_size;
    if (uVar9 <= uVar2) {
      return;
    }
    pcVar3 = (this->m_str).m_start;
    c = pcVar3[uVar2];
    if (c == 0x22) {
      if (this->m_forWhat == ForAttributes) {
        pcVar3 = "&quot;";
        goto LAB_00141144;
      }
      c = 0x22;
LAB_0014117e:
      std::operator<<(os,c);
    }
    else {
      if (c == 0x26) {
        pcVar3 = "&amp;";
      }
      else if (c == 0x3e) {
        if (((uVar2 < 3) || (pcVar3[uVar2 - 1] != ']')) || (pcVar3[uVar2 - 2] != ']')) {
          c = 0x3e;
          goto LAB_0014117e;
        }
        pcVar3 = "&gt;";
      }
      else {
        if (c != 0x3c) {
          if ((8 < c) && (c != 0x7f && 0x11 < (byte)(c - 0xe))) {
            if (c < 0x7f) goto LAB_0014117e;
            if (199 < (byte)(c + 8)) {
              if ((c & 0xe0) == 0xc0) {
                lVar7 = 2;
                uVar1 = 0x1f;
                if (uVar2 + 1 < uVar9) {
LAB_001411f8:
                  uVar4 = (byte)pcVar3[uVar2 + 1] & 0xffffffc0;
                  bVar10 = uVar4 == 0x80;
                  uVar1 = (byte)pcVar3[uVar2 + 1] & 0x3f | (uVar1 & c) << 6;
                  uVar5 = (uint)lVar7;
                  if (2 < uVar5) {
                    bVar10 = ((byte)pcVar3[uVar2 + 2] & 0xffffffc0) == 0x80 && uVar4 == 0x80;
                    uVar1 = (byte)pcVar3[uVar2 + 2] & 0x3f | uVar1 << 6;
                    if (uVar5 != 3) {
                      bVar10 = bVar10 && ((byte)pcVar3[uVar2 + 3] & 0xffffffc0) == 0x80;
                      uVar1 = (byte)pcVar3[uVar2 + 3] & 0x3f | uVar1 << 6;
                    }
                  }
                  if ((((bVar10) && (0x7f < uVar1)) && ((uVar5 < 3 || (0x7ff < uVar1)))) &&
                     ((uVar5 < 4 || 0xf7fe < uVar1 - 0x801 &&
                      (lVar8 = lVar7, uVar9 = uVar2, uVar1 < 0x110000)))) {
                    while (bVar10 = lVar8 != 0, lVar8 = lVar8 + -1, bVar10) {
                      std::operator<<(os,(this->m_str).m_start[uVar9]);
                      uVar9 = uVar9 + 1;
                    }
                    uVar2 = (uVar2 + lVar7) - 1;
                  }
                  else {
                    anon_unknown_26::hexEscapeChar(os,c);
                  }
                  goto LAB_00141183;
                }
              }
              else {
                uVar1 = c & 0xfffffff0;
                uVar6 = (ulong)(uVar1 != 0xe0);
                if (uVar6 + uVar2 + 2 < uVar9) {
                  lVar7 = uVar6 + 3;
                  uVar1 = (uint)(uVar1 == 0xe0) * 8 + 7;
                  goto LAB_001411f8;
                }
              }
            }
          }
          anon_unknown_26::hexEscapeChar(os,c);
          goto LAB_00141183;
        }
        pcVar3 = "&lt;";
      }
LAB_00141144:
      std::operator<<(os,pcVar3);
    }
LAB_00141183:
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void XmlEncode::encodeTo( std::ostream& os ) const {
        // Apostrophe escaping not necessary if we always use " to write attributes
        // (see: http://www.w3.org/TR/xml/#syntax)

        for( std::size_t idx = 0; idx < m_str.size(); ++ idx ) {
            unsigned char c = static_cast<unsigned char>(m_str[idx]);
            switch (c) {
            case '<':   os << "&lt;"; break;
            case '&':   os << "&amp;"; break;

            case '>':
                // See: http://www.w3.org/TR/xml/#syntax
                if (idx > 2 && m_str[idx - 1] == ']' && m_str[idx - 2] == ']')
                    os << "&gt;";
                else
                    os << c;
                break;

            case '\"':
                if (m_forWhat == ForAttributes)
                    os << "&quot;";
                else
                    os << c;
                break;

            default:
                // Check for control characters and invalid utf-8

                // Escape control characters in standard ascii
                // see http://stackoverflow.com/questions/404107/why-are-control-characters-illegal-in-xml-1-0
                if (c < 0x09 || (c > 0x0D && c < 0x20) || c == 0x7F) {
                    hexEscapeChar(os, c);
                    break;
                }

                // Plain ASCII: Write it to stream
                if (c < 0x7F) {
                    os << c;
                    break;
                }

                // UTF-8 territory
                // Check if the encoding is valid and if it is not, hex escape bytes.
                // Important: We do not check the exact decoded values for validity, only the encoding format
                // First check that this bytes is a valid lead byte:
                // This means that it is not encoded as 1111 1XXX
                // Or as 10XX XXXX
                if (c <  0xC0 ||
                    c >= 0xF8) {
                    hexEscapeChar(os, c);
                    break;
                }

                auto encBytes = trailingBytes(c);
                // Are there enough bytes left to avoid accessing out-of-bounds memory?
                if (idx + encBytes - 1 >= m_str.size()) {
                    hexEscapeChar(os, c);
                    break;
                }
                // The header is valid, check data
                // The next encBytes bytes must together be a valid utf-8
                // This means: bitpattern 10XX XXXX and the extracted value is sane (ish)
                bool valid = true;
                uint32_t value = headerValue(c);
                for (std::size_t n = 1; n < encBytes; ++n) {
                    unsigned char nc = static_cast<unsigned char>(m_str[idx + n]);
                    valid &= ((nc & 0xC0) == 0x80);
                    value = (value << 6) | (nc & 0x3F);
                }

                if (
                    // Wrong bit pattern of following bytes
                    (!valid) ||
                    // Overlong encodings
                    (value < 0x80) ||
                    (0x80 <= value && value < 0x800   && encBytes > 2) ||
                    (0x800 < value && value < 0x10000 && encBytes > 3) ||
                    // Encoded value out of range
                    (value >= 0x110000)
                    ) {
                    hexEscapeChar(os, c);
                    break;
                }

                // If we got here, this is in fact a valid(ish) utf-8 sequence
                for (std::size_t n = 0; n < encBytes; ++n) {
                    os << m_str[idx + n];
                }
                idx += encBytes - 1;
                break;
            }
        }
    }